

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_lsd.cpp
# Opt level: O0

void msd_A_lsd_adaptive<6u>(uchar **strings,size_t N)

{
  Cacheblock<6U> *cache_00;
  ulong local_30;
  size_t i_1;
  size_t i;
  Cacheblock<6U> *cache;
  size_t N_local;
  uchar **strings_local;
  
  cache_00 = (Cacheblock<6U> *)malloc(N << 4);
  for (i_1 = 0; i_1 < N; i_1 = i_1 + 1) {
    cache_00[i_1].ptr = strings[i_1];
  }
  fill_cache<6u>(cache_00,N,0);
  msd_lsd_adaptive<6u>(cache_00,N,0);
  for (local_30 = 0; local_30 < N; local_30 = local_30 + 1) {
    strings[local_30] = cache_00[local_30].ptr;
  }
  free(cache_00);
  return;
}

Assistant:

static void
msd_A_lsd_adaptive(unsigned char** strings, size_t N)
{
	Cacheblock<CachedChars>* cache = static_cast<Cacheblock<CachedChars>*>(
			malloc(N*sizeof(Cacheblock<CachedChars>)));
	for (size_t i=0; i < N; ++i) cache[i].ptr = strings[i];
	fill_cache(cache, N, 0);
	msd_lsd_adaptive(cache, N, 0);
	for (size_t i=0; i < N; ++i) strings[i] = cache[i].ptr;
	free(cache);
}